

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

int xmlDictGrow(xmlDictPtr dict,uint size)

{
  ulong uVar1;
  xmlDictEntry *pxVar2;
  undefined4 uVar3;
  uint uVar4;
  xmlDictEntry *__s;
  xmlDictEntry *local_50;
  xmlDictEntry *entry;
  uint i;
  uint oldsize;
  xmlDictEntry *table;
  xmlDictEntry *end;
  xmlDictEntry *oldend;
  xmlDictEntry *oldentry;
  uint size_local;
  xmlDictPtr dict_local;
  
  if ((ulong)size < 0x1000000000000000) {
    __s = (xmlDictEntry *)(*xmlMalloc)((ulong)size << 4);
    if (__s == (xmlDictEntry *)0x0) {
      dict_local._4_4_ = -1;
    }
    else {
      memset(__s,0,(ulong)size << 4);
      uVar1 = dict->size;
      uVar4 = (uint)uVar1;
      if (uVar4 != 0) {
        pxVar2 = dict->table;
        oldend = dict->table;
        while (oldend->hashValue != 0) {
          oldend = oldend + 1;
          if (pxVar2 + (uVar1 & 0xffffffff) <= oldend) {
            oldend = dict->table;
          }
        }
        for (entry._0_4_ = 0; (uint)entry < uVar4; entry._0_4_ = (uint)entry + 1) {
          if (oldend->hashValue != 0) {
            local_50 = __s + (oldend->hashValue & size - 1);
            while (local_50->hashValue != 0) {
              local_50 = local_50 + 1;
              if (__s + size <= local_50) {
                local_50 = __s;
              }
            }
            uVar3 = *(undefined4 *)&oldend->field_0x4;
            local_50->hashValue = oldend->hashValue;
            *(undefined4 *)&local_50->field_0x4 = uVar3;
            local_50->name = oldend->name;
          }
          oldend = oldend + 1;
          if (pxVar2 + (uVar1 & 0xffffffff) <= oldend) {
            oldend = dict->table;
          }
        }
        (*xmlFree)(dict->table);
      }
      dict->table = __s;
      dict->size = (ulong)size;
      dict_local._4_4_ = 0;
    }
  }
  else {
    dict_local._4_4_ = -1;
  }
  return dict_local._4_4_;
}

Assistant:

static int
xmlDictGrow(xmlDictPtr dict, unsigned size) {
    const xmlDictEntry *oldentry, *oldend, *end;
    xmlDictEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = dict->size;
    if (oldsize == 0)
        goto done;

    oldend = &dict->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute dict indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = dict->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = dict->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlDictEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = dict->table;
    }

    xmlFree(dict->table);

done:
    dict->table = table;
    dict->size = size;

    return(0);
}